

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteEnum
               (int field_number,int value,CodedOutputStream *output)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  byte *ptr;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = field_number << 3;
  pbVar2 = output->cur_;
  if ((output->impl_).end_ <= pbVar2) {
    pbVar2 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar2);
  }
  output->cur_ = pbVar2;
  *pbVar2 = (byte)uVar7;
  if (uVar7 < 0x80) {
    ptr = pbVar2 + 1;
  }
  else {
    *pbVar2 = (byte)uVar7 | 0x80;
    pbVar2[1] = (byte)(uVar7 >> 7);
    ptr = pbVar2 + 2;
    if (0x3fff < uVar7) {
      uVar5 = (uint)pbVar2[1];
      uVar7 = uVar7 >> 7;
      do {
        ptr[-1] = (byte)uVar5 | 0x80;
        uVar5 = uVar7 >> 7;
        *ptr = (byte)uVar5;
        ptr = ptr + 1;
        bVar1 = 0x3fff < uVar7;
        uVar7 = uVar5;
      } while (bVar1);
    }
  }
  output->cur_ = ptr;
  if ((output->impl_).end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,ptr);
  }
  output->cur_ = ptr;
  *ptr = (byte)value;
  if ((uint)value < 0x80) {
    pbVar2 = ptr + 1;
  }
  else {
    *ptr = (byte)value | 0x80;
    ptr[1] = (byte)((ulong)(long)value >> 7);
    pbVar2 = ptr + 2;
    if (0x3fff < (uint)value) {
      uVar6 = (ulong)ptr[1];
      uVar4 = (ulong)(long)value >> 7;
      do {
        pbVar2[-1] = (byte)uVar6 | 0x80;
        uVar3 = uVar4 >> 7;
        *pbVar2 = (byte)uVar3;
        pbVar2 = pbVar2 + 1;
        uVar6 = uVar3 & 0xffffffff;
        bVar1 = 0x3fff < uVar4;
        uVar4 = uVar3;
      } while (bVar1);
    }
  }
  output->cur_ = pbVar2;
  return;
}

Assistant:

void WireFormatLite::WriteEnum(int field_number, int value,
                               io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteEnumNoTag(value, output);
}